

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O1

string * __thiscall
CodeGen::generateRecordType_abi_cxx11_(string *__return_storage_ptr__,CodeGen *this,NodePtr *n)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  size_t i;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  string decoratedName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  types;
  char local_81;
  ulong local_80;
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  string *local_40;
  ulong local_38;
  
  local_40 = __return_storage_ptr__;
  iVar3 = (*n->px->_vptr_Node[4])();
  local_80 = CONCAT44(extraout_var,iVar3);
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_80 != 0) {
    uVar7 = 0;
    do {
      iVar3 = (*n->px->_vptr_Node[5])(n->px,uVar7 & 0xffffffff);
      generateType_abi_cxx11_(&local_78,this,(NodePtr *)CONCAT44(extraout_var_00,iVar3));
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                 &local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      uVar7 = uVar7 + 1;
    } while (local_80 != uVar7);
  }
  psVar2 = local_40;
  p_Var6 = (this->done)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->done)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = &p_Var1->_M_header;
  if (p_Var6 != (_Base_ptr)0x0) {
    do {
      bVar9 = p_Var6[1]._M_parent < (_Base_ptr)(n->pn).pi_;
      if (!bVar9) {
        p_Var5 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[bVar9];
    } while (p_Var6 != (_Base_ptr)0x0);
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
     (p_Var6 = p_Var5, (_Base_ptr)(n->pn).pi_ < p_Var5[1]._M_parent)) {
    p_Var6 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var6 == p_Var1) {
    iVar3 = (*n->px->_vptr_Node[3])();
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    lVar8 = *(long *)(CONCAT44(extraout_var_01,iVar3) + 0x20);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,lVar8,*(long *)(CONCAT44(extraout_var_01,iVar3) + 0x28) + lVar8);
    poVar4 = this->os_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"struct ",7);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_78._M_dataplus._M_p,local_78._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," {\n",3);
    if ((local_80 != 0) && (this->noUnion_ == false)) {
      lVar8 = 8;
      uVar7 = 0;
      do {
        iVar3 = (*n->px->_vptr_Node[5])(n->px,uVar7 & 0xffffffff);
        if (*(int *)(*(long *)CONCAT44(extraout_var_02,iVar3) + 8) == 0xc) {
          poVar4 = this->os_;
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    typedef ",0xc);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,*(char **)((long)local_58.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                               lVar8 + -8),
                              *(long *)((long)&((local_58.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + lVar8));
          local_81 = ' ';
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_81,1);
          iVar3 = (*n->px->_vptr_Node[8])(n->px,uVar7 & 0xffffffff);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,*(char **)CONCAT44(extraout_var_03,iVar3),
                              ((undefined8 *)CONCAT44(extraout_var_03,iVar3))[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_t;\n",4);
        }
        uVar7 = uVar7 + 1;
        lVar8 = lVar8 + 0x20;
      } while (local_80 != uVar7);
    }
    if (local_80 != 0) {
      lVar8 = 8;
      uVar7 = 0;
      do {
        if ((this->noUnion_ == false) &&
           (iVar3 = (*n->px->_vptr_Node[5])(n->px,uVar7 & 0xffffffff),
           *(int *)(*(long *)CONCAT44(extraout_var_04,iVar3) + 8) == 0xc)) {
          poVar4 = this->os_;
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    ",4);
          iVar3 = (*n->px->_vptr_Node[8])(n->px,uVar7 & 0xffffffff);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,*(char **)CONCAT44(extraout_var_05,iVar3),
                              ((undefined8 *)CONCAT44(extraout_var_05,iVar3))[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_t",2);
        }
        else {
          poVar4 = this->os_;
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    ",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,*(char **)((long)local_58.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar8 + -8)
                     ,*(long *)((long)&((local_58.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar8));
        }
        local_81 = ' ';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(this->os_,&local_81,1);
        iVar3 = (*n->px->_vptr_Node[8])(n->px,uVar7 & 0xffffffff);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,*(char **)CONCAT44(extraout_var_06,iVar3),
                            ((undefined8 *)CONCAT44(extraout_var_06,iVar3))[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
        uVar7 = uVar7 + 1;
        lVar8 = lVar8 + 0x20;
      } while (local_80 != uVar7);
    }
    poVar4 = this->os_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    ",4);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_78._M_dataplus._M_p,local_78._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"()",2);
    if (local_80 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(this->os_," :",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->os_,"\n",1);
    if (local_80 != 0) {
      local_38 = local_80 - 1;
      lVar8 = 8;
      uVar7 = 0;
      do {
        poVar4 = this->os_;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"        ",8);
        iVar3 = (*n->px->_vptr_Node[8])(n->px,uVar7 & 0xffffffff);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,*(char **)CONCAT44(extraout_var_07,iVar3),
                            ((undefined8 *)CONCAT44(extraout_var_07,iVar3))[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(",1);
        if ((this->noUnion_ == false) &&
           (iVar3 = (*n->px->_vptr_Node[5])(n->px,uVar7 & 0xffffffff),
           *(int *)(*(long *)CONCAT44(extraout_var_08,iVar3) + 8) == 0xc)) {
          poVar4 = this->os_;
          iVar3 = (*n->px->_vptr_Node[8])(n->px,uVar7 & 0xffffffff);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,*(char **)CONCAT44(extraout_var_09,iVar3),
                              ((undefined8 *)CONCAT44(extraout_var_09,iVar3))[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_t",2);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    (this->os_,
                     *(char **)((long)local_58.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar8 + -8),
                     *(long *)((long)&((local_58.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar8));
        }
        std::__ostream_insert<char,std::char_traits<char>>(this->os_,"())",3);
        if (local_38 != uVar7) {
          local_81 = ',';
          std::__ostream_insert<char,std::char_traits<char>>(this->os_,&local_81,1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(this->os_,"\n",1);
        uVar7 = uVar7 + 1;
        lVar8 = lVar8 + 0x20;
      } while (local_80 != uVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->os_,"        { }\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(this->os_,"};\n\n",4);
    iVar3 = (*n->px->_vptr_Node[3])();
    (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
    lVar8 = *(long *)(CONCAT44(extraout_var_10,iVar3) + 0x20);
    std::__cxx11::string::_M_construct<char*>
              ((string *)psVar2,lVar8,*(long *)(CONCAT44(extraout_var_10,iVar3) + 0x28) + lVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (local_40->_M_dataplus)._M_p = (pointer)&local_40->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,p_Var6[1]._M_left,
               (long)&(p_Var6[1]._M_right)->_M_color + (long)p_Var6[1]._M_left);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return psVar2;
}

Assistant:

string CodeGen::generateRecordType(const NodePtr& n)
{
    size_t c = n->leaves();
    vector<string> types;
    for (size_t i = 0; i < c; ++i) {
        types.push_back(generateType(n->leafAt(i)));
    }

    map<NodePtr, string>::const_iterator it = done.find(n);
    if (it != done.end()) {
        return it->second;
    }

    string decoratedName = decorate(n->name());
    os_ << "struct " << decoratedName << " {\n";
    if (! noUnion_) {
        for (size_t i = 0; i < c; ++i) {
            if (n->leafAt(i)->type() == avro::AVRO_UNION) {
                os_ << "    typedef " << types[i]
                    << ' ' << n->nameAt(i) << "_t;\n";
            }
        }
    }
    for (size_t i = 0; i < c; ++i) {
        if (! noUnion_ && n->leafAt(i)->type() == avro::AVRO_UNION) {
            os_ << "    " << n->nameAt(i) << "_t";
        } else {
            os_ << "    " << types[i];
        }
        os_ << ' ' << n->nameAt(i) << ";\n";
    }

    os_ << "    " << decoratedName << "()";
    if (c > 0) {
        os_ << " :";
    }
    os_ << "\n";
    for (size_t i = 0; i < c; ++i) {
        os_ << "        " << n->nameAt(i) << "(";
        if (! noUnion_ && n->leafAt(i)->type() == avro::AVRO_UNION) {
            os_ << n->nameAt(i) << "_t";
        } else {
            os_ << types[i];
        }
        os_ << "())";
        if (i != (c - 1)) {
            os_ << ',';
        }
        os_ << "\n";
    }
    os_ << "        { }\n";
    os_ << "};\n\n";
    return decorate(n->name());
}